

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O0

void __thiscall
icu_63::IndianCalendar::handleComputeFields
          (IndianCalendar *this,int32_t julianDay,UErrorCode *param_2)

{
  UBool UVar1;
  int iVar2;
  int32_t *piVar3;
  int iVar4;
  double dVar5;
  int32_t local_50 [2];
  int32_t gd [3];
  int32_t gregorianYear;
  int32_t mday;
  int32_t IndianDayOfMonth;
  int32_t IndianMonth;
  int32_t yday;
  int32_t IndianYear;
  int32_t leapMonth;
  double jdAtStartOfGregYear;
  UErrorCode *param_2_local;
  int32_t julianDay_local;
  IndianCalendar *this_local;
  
  piVar3 = jdToGregorian((double)julianDay,local_50);
  iVar4 = *piVar3;
  IndianMonth = iVar4 + -0x4e;
  gd[1] = iVar4;
  dVar5 = gregorianToJD(iVar4,1,1);
  iVar2 = (int)((double)julianDay - dVar5);
  if (iVar2 < 0x50) {
    IndianMonth = iVar4 + -0x4f;
    UVar1 = isGregorianLeap(gd[1] + -1);
    yday = 0x1e;
    if (UVar1 != '\0') {
      yday = 0x1f;
    }
    IndianDayOfMonth = yday + 0xff + iVar2;
  }
  else {
    UVar1 = isGregorianLeap(gd[1]);
    yday = 0x1e;
    if (UVar1 != '\0') {
      yday = 0x1f;
    }
    IndianDayOfMonth = iVar2 + -0x50;
  }
  if (IndianDayOfMonth < yday) {
    mday = 0;
    iVar4 = IndianDayOfMonth;
  }
  else {
    gd[2] = IndianDayOfMonth - yday;
    if (gd[2] < 0x9b) {
      dVar5 = uprv_floor_63((double)(gd[2] / 0x1f));
      mday = (int)dVar5 + 1;
      iVar4 = gd[2] % 0x1f;
    }
    else {
      gd[2] = gd[2] + -0x9b;
      dVar5 = uprv_floor_63((double)(gd[2] / 0x1e));
      mday = (int)dVar5 + 6;
      iVar4 = gd[2] % 0x1e;
    }
  }
  gregorianYear = iVar4 + 1;
  Calendar::internalSet(&this->super_Calendar,UCAL_ERA,0);
  Calendar::internalSet(&this->super_Calendar,UCAL_EXTENDED_YEAR,IndianMonth);
  Calendar::internalSet(&this->super_Calendar,UCAL_YEAR,IndianMonth);
  Calendar::internalSet(&this->super_Calendar,UCAL_MONTH,mday);
  Calendar::internalSet(&this->super_Calendar,UCAL_DATE,gregorianYear);
  Calendar::internalSet(&this->super_Calendar,UCAL_DAY_OF_YEAR,IndianDayOfMonth + 1);
  return;
}

Assistant:

void IndianCalendar::handleComputeFields(int32_t julianDay, UErrorCode&  /* status */) {
    double jdAtStartOfGregYear;
    int32_t leapMonth, IndianYear, yday, IndianMonth, IndianDayOfMonth, mday;
    int32_t gregorianYear;      // Stores gregorian date corresponding to Julian day;
    int32_t gd[3];

    gregorianYear = jdToGregorian(julianDay, gd)[0];          // Gregorian date for Julian day
    IndianYear = gregorianYear - INDIAN_ERA_START;            // Year in Saka era
    jdAtStartOfGregYear = gregorianToJD(gregorianYear, 1, 1); // JD at start of Gregorian year
    yday = (int32_t)(julianDay - jdAtStartOfGregYear);        // Day number in Gregorian year (starting from 0)

    if (yday < INDIAN_YEAR_START) {
        // Day is at the end of the preceding Saka year
        IndianYear -= 1;
        leapMonth = isGregorianLeap(gregorianYear - 1) ? 31 : 30; // Days in leapMonth this year, previous Gregorian year
        yday += leapMonth + (31 * 5) + (30 * 3) + 10;
    } else {
        leapMonth = isGregorianLeap(gregorianYear) ? 31 : 30; // Days in leapMonth this year
        yday -= INDIAN_YEAR_START;
    }

    if (yday < leapMonth) {
        IndianMonth = 0;
        IndianDayOfMonth = yday + 1;
    } else {
        mday = yday - leapMonth;
        if (mday < (31 * 5)) {
            IndianMonth = (int32_t)uprv_floor(mday / 31) + 1;
            IndianDayOfMonth = (mday % 31) + 1;
        } else {
            mday -= 31 * 5;
            IndianMonth = (int32_t)uprv_floor(mday / 30) + 6;
            IndianDayOfMonth = (mday % 30) + 1;
        }
   }

   internalSet(UCAL_ERA, 0);
   internalSet(UCAL_EXTENDED_YEAR, IndianYear);
   internalSet(UCAL_YEAR, IndianYear);
   internalSet(UCAL_MONTH, IndianMonth);
   internalSet(UCAL_DAY_OF_MONTH, IndianDayOfMonth);
   internalSet(UCAL_DAY_OF_YEAR, yday + 1); // yday is 0-based
}